

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

int nni_sock_open(nni_sock **sockp,nni_proto *proto)

{
  nni_stat_item *item;
  nni_stat_item *item_00;
  nni_stat_item *item_01;
  nni_proto_pipe_ops *pnVar1;
  nni_proto_ctx_ops *pnVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  char *pcVar13;
  undefined6 uVar14;
  size_t sVar15;
  int iVar16;
  nni_sock *s;
  long lVar17;
  nni_proto_sock_ops *pnVar18;
  nni_proto_sock_ops *pnVar19;
  byte bVar20;
  undefined1 local_31;
  
  bVar20 = 0;
  if (proto->proto_version != 0x50520003) {
    return 9;
  }
  s = (nni_sock *)nni_zalloc(proto->proto_sock_ops->sock_size + 0x558);
  if (s == (nni_sock *)0x0) {
    iVar16 = 2;
  }
  else {
    s->s_data = s + 1;
    s->s_sndtimeo = -1;
    s->s_rcvtimeo = -1;
    s->s_reconn = 1000;
    s->s_reconnmax = 0;
    s->s_rcvmaxsz = 0;
    s->s_id = 0;
    s->s_ref = 0;
    uVar14 = *(undefined6 *)&(proto->proto_self).field_0x2;
    pcVar13 = (proto->proto_self).p_name;
    (s->s_self_id).p_id = (proto->proto_self).p_id;
    *(undefined6 *)&(s->s_self_id).field_0x2 = uVar14;
    (s->s_self_id).p_name = pcVar13;
    uVar14 = *(undefined6 *)&(proto->proto_peer).field_0x2;
    pcVar13 = (proto->proto_peer).p_name;
    (s->s_peer_id).p_id = (proto->proto_peer).p_id;
    *(undefined6 *)&(s->s_peer_id).field_0x2 = uVar14;
    (s->s_peer_id).p_name = pcVar13;
    s->s_flags = proto->proto_flags;
    pnVar18 = proto->proto_sock_ops;
    pnVar19 = &s->s_sock_ops;
    for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
      pnVar19->sock_size = pnVar18->sock_size;
      pnVar18 = (nni_proto_sock_ops *)((long)pnVar18 + (ulong)bVar20 * -0x10 + 8);
      pnVar19 = (nni_proto_sock_ops *)((long)pnVar19 + (ulong)bVar20 * -0x10 + 8);
    }
    pnVar1 = proto->proto_pipe_ops;
    sVar15 = pnVar1->pipe_size;
    uVar3 = *(undefined4 *)((long)&pnVar1->pipe_size + 4);
    uVar4 = *(undefined4 *)&pnVar1->pipe_init;
    uVar5 = *(undefined4 *)((long)&pnVar1->pipe_init + 4);
    uVar6 = *(undefined4 *)&pnVar1->pipe_fini;
    uVar7 = *(undefined4 *)((long)&pnVar1->pipe_fini + 4);
    uVar8 = *(undefined4 *)&pnVar1->pipe_start;
    uVar9 = *(undefined4 *)((long)&pnVar1->pipe_start + 4);
    uVar10 = *(undefined4 *)((long)&pnVar1->pipe_close + 4);
    uVar11 = *(undefined4 *)&pnVar1->pipe_stop;
    uVar12 = *(undefined4 *)((long)&pnVar1->pipe_stop + 4);
    *(undefined4 *)&(s->s_pipe_ops).pipe_close = *(undefined4 *)&pnVar1->pipe_close;
    *(undefined4 *)((long)&(s->s_pipe_ops).pipe_close + 4) = uVar10;
    *(undefined4 *)&(s->s_pipe_ops).pipe_stop = uVar11;
    *(undefined4 *)((long)&(s->s_pipe_ops).pipe_stop + 4) = uVar12;
    *(undefined4 *)&(s->s_pipe_ops).pipe_fini = uVar6;
    *(undefined4 *)((long)&(s->s_pipe_ops).pipe_fini + 4) = uVar7;
    *(undefined4 *)&(s->s_pipe_ops).pipe_start = uVar8;
    *(undefined4 *)((long)&(s->s_pipe_ops).pipe_start + 4) = uVar9;
    *(int *)&(s->s_pipe_ops).pipe_size = (int)sVar15;
    *(undefined4 *)((long)&(s->s_pipe_ops).pipe_size + 4) = uVar3;
    *(undefined4 *)&(s->s_pipe_ops).pipe_init = uVar4;
    *(undefined4 *)((long)&(s->s_pipe_ops).pipe_init + 4) = uVar5;
    s->s_closing = false;
    s->s_closed = false;
    pnVar2 = proto->proto_ctx_ops;
    if (pnVar2 != (nni_proto_ctx_ops *)0x0) {
      sVar15 = pnVar2->ctx_size;
      uVar3 = *(undefined4 *)((long)&pnVar2->ctx_size + 4);
      uVar4 = *(undefined4 *)&pnVar2->ctx_init;
      uVar5 = *(undefined4 *)((long)&pnVar2->ctx_init + 4);
      uVar6 = *(undefined4 *)&pnVar2->ctx_fini;
      uVar7 = *(undefined4 *)((long)&pnVar2->ctx_fini + 4);
      uVar8 = *(undefined4 *)&pnVar2->ctx_recv;
      uVar9 = *(undefined4 *)((long)&pnVar2->ctx_recv + 4);
      uVar10 = *(undefined4 *)((long)&pnVar2->ctx_send + 4);
      uVar11 = *(undefined4 *)&pnVar2->ctx_options;
      uVar12 = *(undefined4 *)((long)&pnVar2->ctx_options + 4);
      *(undefined4 *)&(s->s_ctx_ops).ctx_send = *(undefined4 *)&pnVar2->ctx_send;
      *(undefined4 *)((long)&(s->s_ctx_ops).ctx_send + 4) = uVar10;
      *(undefined4 *)&(s->s_ctx_ops).ctx_options = uVar11;
      *(undefined4 *)((long)&(s->s_ctx_ops).ctx_options + 4) = uVar12;
      *(undefined4 *)&(s->s_ctx_ops).ctx_fini = uVar6;
      *(undefined4 *)((long)&(s->s_ctx_ops).ctx_fini + 4) = uVar7;
      *(undefined4 *)&(s->s_ctx_ops).ctx_recv = uVar8;
      *(undefined4 *)((long)&(s->s_ctx_ops).ctx_recv + 4) = uVar9;
      *(int *)&(s->s_ctx_ops).ctx_size = (int)sVar15;
      *(undefined4 *)((long)&(s->s_ctx_ops).ctx_size + 4) = uVar3;
      *(undefined4 *)&(s->s_ctx_ops).ctx_init = uVar4;
      *(undefined4 *)((long)&(s->s_ctx_ops).ctx_init + 4) = uVar5;
    }
    if ((s->s_sock_ops).sock_open == (_func_void_void_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
                0x212,"s->s_sock_ops.sock_open != NULL");
    }
    if ((s->s_sock_ops).sock_close == (_func_void_void_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
                0x213,"s->s_sock_ops.sock_close != NULL");
    }
    (s->s_node).ln_next = (nni_list_node *)0x0;
    (s->s_node).ln_prev = (nni_list_node *)0x0;
    nni_list_init_offset(&s->s_ctxs,0);
    nni_list_init_offset(&s->s_pipes,0x98);
    nni_list_init_offset(&s->s_listeners,0x80);
    nni_list_init_offset(&s->s_dialers,0x70);
    nni_mtx_init(&s->s_mx);
    nni_mtx_init(&s->s_pipe_cbs_mtx);
    nni_cv_init(&s->s_cv,&s->s_mx);
    nni_cv_init(&s->s_close_cv,&sock_lk);
    item = &s->st_root;
    nni_stat_init(item,(nni_stat_info *)sock_stats_init_root_info);
    item_00 = &s->st_id;
    nni_stat_init(item_00,(nni_stat_info *)sock_stats_init_id_info);
    nni_stat_add(item,item_00);
    item_01 = &s->st_protocol;
    nni_stat_init(item_01,(nni_stat_info *)sock_stats_init_protocol_info);
    nni_stat_add(item,item_01);
    nni_stat_init(&s->st_dialers,(nni_stat_info *)sock_stats_init_dialers_info);
    nni_stat_add(item,&s->st_dialers);
    nni_stat_init(&s->st_listeners,(nni_stat_info *)sock_stats_init_listeners_info);
    nni_stat_add(item,&s->st_listeners);
    nni_stat_init(&s->st_pipes,(nni_stat_info *)sock_stats_init_pipes_info);
    nni_stat_add(item,&s->st_pipes);
    nni_stat_init(&s->st_rejects,(nni_stat_info *)sock_stats_init_reject_info);
    nni_stat_add(item,&s->st_rejects);
    nni_stat_init(&s->st_tx_msgs,(nni_stat_info *)sock_stats_init_tx_msgs_info);
    nni_stat_add(item,&s->st_tx_msgs);
    nni_stat_init(&s->st_rx_msgs,(nni_stat_info *)sock_stats_init_rx_msgs_info);
    nni_stat_add(item,&s->st_rx_msgs);
    nni_stat_init(&s->st_tx_bytes,(nni_stat_info *)sock_stats_init_tx_bytes_info);
    nni_stat_add(item,&s->st_tx_bytes);
    nni_stat_init(&s->st_rx_bytes,(nni_stat_info *)sock_stats_init_rx_bytes_info);
    nni_stat_add(item,&s->st_rx_bytes);
    nni_stat_set_id(item_00,s->s_id);
    nni_stat_set_string(item_01,(s->s_self_id).p_name);
    iVar16 = nni_msgq_init(&s->s_uwq,0);
    if ((iVar16 == 0) && (iVar16 = nni_msgq_init(&s->s_urq,1), iVar16 == 0)) {
      (*(s->s_sock_ops).sock_init)(s->s_data,s);
      nni_sock_setopt(s,"send-timeout",&s->s_sndtimeo,4,NNI_TYPE_DURATION);
      nni_sock_setopt(s,"recv-timeout",&s->s_rcvtimeo,4,NNI_TYPE_DURATION);
      nni_sock_setopt(s,"recv-size-max",&s->s_rcvmaxsz,8,NNI_TYPE_SIZE);
      local_31 = 1;
      nni_sock_setopt(s,"tcp-nodelay",&local_31,1,NNI_TYPE_BOOL);
      local_31 = 0;
      nni_sock_setopt(s,"tcp-keepalive",&local_31,1,NNI_TYPE_BOOL);
      iVar16 = 0;
      goto LAB_00115b66;
    }
    sock_destroy(s);
  }
  s = (nni_sock *)0x0;
LAB_00115b66:
  if (iVar16 == 0) {
    nni_mtx_lock(&sock_lk);
    iVar16 = nni_id_alloc32(&sock_ids,&s->s_id,s);
    if (iVar16 == 0) {
      nni_list_append(&sock_list,s);
      (*(s->s_sock_ops).sock_open)(s->s_data);
      *sockp = s;
      nni_mtx_unlock(&sock_lk);
      nni_stat_set_id(&s->st_id,s->s_id);
      nni_stat_set_id(&s->st_root,s->s_id);
      nni_stat_register(&s->st_root);
      iVar16 = 0;
    }
    else {
      nni_mtx_unlock(&sock_lk);
      sock_destroy(s);
    }
  }
  return iVar16;
}

Assistant:

int
nni_sock_open(nni_sock **sockp, const nni_proto *proto)
{
	nni_sock *s = NULL;
	int       rv;

	if (proto->proto_version != NNI_PROTOCOL_VERSION) {
		// unsupported protocol version
		return (NNG_ENOTSUP);
	}

	if ((rv = nni_sock_create(&s, proto)) != 0) {
		return (rv);
	}

	nni_mtx_lock(&sock_lk);
	if ((rv = nni_id_alloc32(&sock_ids, &s->s_id, s)) != 0) {
		nni_mtx_unlock(&sock_lk);
		sock_destroy(s);
		return (rv);
	} else {
		nni_list_append(&sock_list, s);
		s->s_sock_ops.sock_open(s->s_data);
		*sockp = s;
	}
	nni_mtx_unlock(&sock_lk);

#ifdef NNG_ENABLE_STATS
	// Set up basic stat values.  The socket id wasn't
	// known at stat creation time, so we set it now.
	nni_stat_set_id(&s->st_id, (int) s->s_id);
	nni_stat_set_id(&s->st_root, (int) s->s_id);

	// Add our stats chain.
	nni_stat_register(&s->st_root);
#endif

	return (0);
}